

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::dht_announce(torrent *this)

{
  anon_class_24_3_bfd47678 f;
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  element_type *peVar4;
  session_settings *psVar5;
  time_point tVar6;
  info_hash_t *this_00;
  enable_shared_from_this<libtorrent::aux::torrent> local_40;
  undefined1 local_30 [8];
  weak_ptr<libtorrent::aux::torrent> self;
  announce_flags_t flags;
  torrent *this_local;
  
  iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x49])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    (*(this->super_request_callback)._vptr_request_callback[7])(this,"DHT: no dht initialized");
  }
  else {
    bVar1 = should_announce_dht(this);
    if (bVar1) {
      (*(this->super_request_callback)._vptr_request_callback[7])(this,"START DHT announce");
      tVar6 = time_now();
      (this->m_dht_start_time).__d.__r = (rep)tVar6.__d.__r;
      bVar1 = is_seed(this);
      if (bVar1) {
        self.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._7_1_ = 1;
      }
      else {
        libtorrent::flags::
        bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>::bitfield_flag
                  ((bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void> *)
                   ((long)&self.
                           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
      }
      bVar1 = is_ssl_torrent(this);
      if (bVar1) {
        self.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._6_1_ = 4;
        libtorrent::flags::
        bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>::operator|=
                  ((bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void> *)
                   ((long)&self.
                           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7),
                   (bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>)0x4);
      }
      else {
        psVar5 = settings(this);
        bVar1 = session_settings::get_bool(psVar5,0x8021);
        if (bVar1) {
          self.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._5_1_ = 2;
          libtorrent::flags::
          bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>::operator|=
                    ((bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void> *)
                     ((long)&self.
                             super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 7),
                     (bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>)0x2
                    );
        }
      }
      ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this(&local_40);
      ::std::weak_ptr<libtorrent::aux::torrent>::weak_ptr<libtorrent::aux::torrent,void>
                ((weak_ptr<libtorrent::aux::torrent> *)local_30,
                 (shared_ptr<libtorrent::aux::torrent> *)&local_40);
      ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
                ((shared_ptr<libtorrent::aux::torrent> *)&local_40);
      peVar4 = ::std::
               __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&(this->super_torrent_hot_members).m_torrent_file);
      this_00 = torrent_info::info_hashes(peVar4);
      f.flags = (announce_flags_t *)
                ((long)&self.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 7);
      f.this = this;
      f.self = (weak_ptr<libtorrent::aux::torrent> *)local_30;
      info_hash_t::for_each<libtorrent::aux::torrent::dht_announce()::__0>(this_00,f);
      ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
                ((weak_ptr<libtorrent::aux::torrent> *)local_30);
    }
    else {
      uVar3 = (*(this->super_request_callback)._vptr_request_callback[6])();
      if ((uVar3 & 1) != 0) {
        bVar1 = is_i2p(this);
        if (bVar1) {
          psVar5 = settings(this);
          bVar1 = session_settings::get_bool(psVar5,0x8017);
          if (!bVar1) {
            (*(this->super_request_callback)._vptr_request_callback[7])
                      (this,"DHT: i2p torrent (and mixed peers not allowed)");
          }
        }
        uVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[0x45])();
        if ((uVar3 & 1) == 0) {
          (*(this->super_request_callback)._vptr_request_callback[7])(this,"DHT: no listen sockets")
          ;
        }
        peVar4 = ::std::
                 __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&(this->super_torrent_hot_members).m_torrent_file);
        bVar1 = torrent_info::is_valid(peVar4);
        if ((bVar1) && (((byte)this->field_0x5c0 >> 3 & 1) == 0)) {
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"DHT: files not checked, skipping DHT announce");
        }
        if ((*(uint *)&this->field_0x5dd >> 0x18 & 1) == 0) {
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"DHT: queueing disabled DHT announce");
        }
        if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1b & 1) != 0) {
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"DHT: torrent paused, no DHT announce");
        }
        if (((byte)this->field_0x5cc >> 5 & 1) == 0) {
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"DHT: torrent has DHT disabled flag");
        }
        peVar4 = ::std::
                 __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&(this->super_torrent_hot_members).m_torrent_file);
        bVar1 = torrent_info::is_valid(peVar4);
        if (bVar1) {
          peVar4 = ::std::
                   __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&(this->super_torrent_hot_members).m_torrent_file);
          bVar1 = torrent_info::priv(peVar4);
          if (bVar1) {
            (*(this->super_request_callback)._vptr_request_callback[7])
                      (this,"DHT: private torrent, no DHT announce");
          }
        }
        psVar5 = settings(this);
        bVar1 = session_settings::get_bool(psVar5,0x8004);
        if ((bVar1) && (bVar1 = tracker_list::any_verified(&this->m_trackers), bVar1)) {
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"DHT: only using DHT as fallback and there are working trackers");
        }
      }
    }
  }
  return;
}

Assistant:

void torrent::dht_announce()
	{
		TORRENT_ASSERT(is_single_thread());
		if (!m_ses.dht())
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("DHT: no dht initialized");
#endif
			return;
		}
		if (!should_announce_dht())
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
#if TORRENT_USE_I2P
				if (is_i2p() && !settings().get_bool(settings_pack::allow_i2p_mixed))
					debug_log("DHT: i2p torrent (and mixed peers not allowed)");
#endif
				if (!m_ses.announce_dht())
					debug_log("DHT: no listen sockets");

				if (m_torrent_file->is_valid() && !m_files_checked)
					debug_log("DHT: files not checked, skipping DHT announce");

				if (!m_announce_to_dht)
					debug_log("DHT: queueing disabled DHT announce");

				if (m_paused)
					debug_log("DHT: torrent paused, no DHT announce");

				if (!m_enable_dht)
					debug_log("DHT: torrent has DHT disabled flag");

				if (m_torrent_file->is_valid() && m_torrent_file->priv())
					debug_log("DHT: private torrent, no DHT announce");

				if (settings().get_bool(settings_pack::use_dht_as_fallback)
					&& m_trackers.any_verified())
				{
					debug_log("DHT: only using DHT as fallback and there are working trackers");
				}
			}
#endif
			return;
		}

		TORRENT_ASSERT(!m_paused);

#ifndef TORRENT_DISABLE_LOGGING
		debug_log("START DHT announce");
		m_dht_start_time = aux::time_now();
#endif

		// if we're a seed, we tell the DHT for better scrape stats
		dht::announce_flags_t flags = is_seed() ? dht::announce::seed : dht::announce_flags_t{};

		// If this is an SSL torrent the announce needs to specify an SSL
		// listen port. DHT nodes only operate on non-SSL ports so SSL
		// torrents cannot use implied_port.
		// if we allow incoming uTP connections, set the implied_port
		// argument in the announce, this will make the DHT node use
		// our source port in the packet as our listen port, which is
		// likely more accurate when behind a NAT
		if (is_ssl_torrent())
		{
			flags |= dht::announce::ssl_torrent;
		}
		else if (settings().get_bool(settings_pack::enable_incoming_utp))
		{
			flags |= dht::announce::implied_port;
		}

		std::weak_ptr<torrent> self(shared_from_this());
		m_torrent_file->info_hashes().for_each([&](sha1_hash const& ih, protocol_version v)
		{
			m_ses.dht()->announce(ih, 0, flags
				, std::bind(&torrent::on_dht_announce_response_disp, self, v, _1));
		});
	}